

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall google::protobuf::compiler::Parser::Consume(Parser *this,char *text)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  allocator<char> local_81;
  long *local_80;
  long local_78;
  long local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  bVar2 = TryConsume(this,text);
  if (!bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,text,&local_81);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x3a9f4a);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_50 = *plVar4;
      lStack_48 = plVar3[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar4;
      local_60 = (long *)*plVar3;
    }
    local_58 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_70 = *plVar4;
      uStack_68 = (undefined4)plVar3[3];
      uStack_64 = *(undefined4 *)((long)plVar3 + 0x1c);
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar4;
      local_80 = (long *)*plVar3;
    }
    local_78 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    pEVar1 = this->error_collector_;
    if (pEVar1 != (ErrorCollector *)0x0) {
      (*pEVar1->_vptr_ErrorCollector[2])
                (pEVar1,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,&local_80);
    }
    this->had_errors_ = true;
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return bVar2;
}

Assistant:

bool Parser::Consume(const char* text) {
  if (TryConsume(text)) {
    return true;
  } else {
    AddError("Expected \"" + string(text) + "\".");
    return false;
  }
}